

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O2

int __thiscall TURBOLINECOUNT::CLineCount::open(CLineCount *this,char *__file,int __oflag,...)

{
  bool bVar1;
  undefined8 unaff_RBX;
  allocator<char> local_39;
  string local_38 [32];
  
  bVar1 = this->m_opened;
  if (bVar1 == true) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,"file already opened",&local_39);
    this->m_lasterror = 0x11;
    std::__cxx11::string::_M_assign((string *)&this->m_lasterrorstring);
    std::__cxx11::string::~string(local_38);
  }
  else {
    this->m_fh = (tlc_filehandle_t)__file;
    this->m_opened = true;
    this->m_auto_close = SUB41(__oflag,0);
  }
  return (uint)CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar1) ^ 1;
}

Assistant:

bool CLineCount::open(tlc_filehandle_t fhandle, bool auto_close)
{
	if (m_opened)
	{
		setLastError(EEXIST, _T("file already opened"));
		return false;
	}

	m_fh = fhandle;
	m_opened = true;
	m_auto_close = auto_close;

	return true;
}